

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O3

void __thiscall Js::EquivalentTypeSet::SortAndRemoveDuplicates(EquivalentTypeSet *this)

{
  char *pcVar1;
  JITTypeHolderBase<Memory::Recycler> *pJVar2;
  JITTypeHolderBase<Memory::Recycler> *pJVar3;
  JITType *pJVar4;
  JITTypeHolderBase<void> JVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  short sVar10;
  ulong uVar11;
  Type *pTVar12;
  ushort uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  JITType *pJVar17;
  JITTypeHolderBase<void> local_70;
  JITType *local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  JITType *local_40;
  EquivalentTypeSet *local_38;
  
  uVar14 = (ulong)this->count;
  uVar15 = 1;
  local_38 = this;
  if (1 < uVar14) {
    lVar16 = 8;
    uVar11 = 0;
    uVar6 = 1;
    lVar7 = lVar16;
    uVar8 = uVar11;
    local_48 = uVar14;
LAB_0040d4a0:
    do {
      local_50 = uVar8;
      local_58 = lVar7;
      local_60 = uVar6;
      pJVar2 = (this->types).ptr;
      uVar14 = uVar11 & 0xffffffff;
      bVar9 = JITTypeHolderBase<Memory::Recycler>::operator>
                        (pJVar2 + uVar14,
                         (JITTypeHolderBase<Memory::Recycler> *)((long)&(pJVar2->t).ptr + lVar16));
      if (bVar9) {
        pJVar2 = (local_38->types).ptr;
        pcVar1 = (char *)((long)&(pJVar2->t).ptr + lVar16);
        local_40 = *(JITType **)((long)&(pJVar2->t).ptr + lVar16);
        local_68 = pJVar2[uVar14].t.ptr;
        Memory::Recycler::WBSetBit(pcVar1);
        this = local_38;
        *(JITType **)((long)&(pJVar2->t).ptr + lVar16) = local_68;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar1);
        pJVar2 = (this->types).ptr + uVar14;
        Memory::Recycler::WBSetBit((char *)pJVar2);
        (pJVar2->t).ptr = local_40;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pJVar2);
        lVar16 = lVar16 + -8;
        sVar10 = (short)uVar11;
        uVar11 = uVar11 - 1;
        uVar6 = local_60;
        lVar7 = local_58;
        uVar8 = local_50;
        if (sVar10 != 0) goto LAB_0040d4a0;
      }
      uVar14 = local_48;
      uVar11 = local_50 + 1;
      lVar16 = local_58 + 8;
      uVar6 = local_60 + 1;
      lVar7 = lVar16;
      uVar8 = uVar11;
    } while (local_60 + 1 != local_48);
    uVar15 = 1;
    if (1 < (ushort)local_48) {
      pJVar17 = (JITType *)(ulong)(uint)((int)local_48 * 8);
      pTVar12 = (Type *)&DAT_00000008;
      uVar11 = 0;
      local_40 = pJVar17;
      do {
        pJVar2 = (this->types).ptr;
        bVar9 = JITTypeHolderBase<Memory::Recycler>::operator!=
                          (pJVar2 + (uVar11 & 0xffff),
                           (JITTypeHolderBase<Memory::Recycler> *)
                           ((long)&(pJVar2->t).ptr + (long)&((Type *)&pTVar12->ptr)->exists));
        if (bVar9) {
          pJVar3 = (this->types).ptr;
          uVar15 = (int)uVar11 + 1;
          pJVar2 = pJVar3 + (uVar15 & 0xffff);
          pJVar4 = *(JITType **)((long)&(pJVar3->t).ptr + (long)&((Type *)&pTVar12->ptr)->exists);
          Memory::Recycler::WBSetBit((char *)pJVar2);
          this = local_38;
          pJVar17 = local_40;
          (pJVar2->t).ptr = pJVar4;
          uVar11 = (ulong)uVar15;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pJVar2);
        }
        pTVar12 = pTVar12 + 1;
      } while (pJVar17 != (JITType *)pTVar12);
      uVar15 = (int)uVar11 + 1;
    }
  }
  this->count = (ushort)uVar15;
  if ((ushort)uVar15 < (ushort)uVar14) {
    uVar11 = (ulong)((uVar15 & 0xffff) << 3);
    uVar15 = (int)uVar14 - uVar15;
    do {
      JITTypeHolderBase<void>::JITTypeHolderBase(&local_70,(JITType *)0x0);
      JVar5.t = local_70.t;
      pJVar2 = (local_38->types).ptr;
      pcVar1 = (char *)((long)&(pJVar2->t).ptr + uVar11);
      Memory::Recycler::WBSetBit(pcVar1);
      this = local_38;
      *(Type *)((long)&(pJVar2->t).ptr + uVar11) = JVar5.t;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar1);
      uVar11 = uVar11 + 8;
      uVar13 = (short)uVar15 - 1;
      uVar15 = (uint)uVar13;
    } while (uVar13 != 0);
  }
  this->sortedAndDuplicatesRemoved = true;
  return;
}

Assistant:

void EquivalentTypeSet::SortAndRemoveDuplicates()
{
    uint16 oldCount = this->count;
    uint16 i;

    // sorting
    for (i = 1; i < oldCount; i++)
    {
        uint16 j = i;
        while (j > 0 && (this->types[j - 1] > this->types[j]))
        {
            JITTypeHolder tmp = this->types[j];
            this->types[j] = this->types[j - 1];
            this->types[j - 1] = tmp;
            j--;
        }
    }

    // removing duplicate types from the sorted set
    i = 0;
    for (uint16 j = 1; j < oldCount; j++)
    {
        if (this->types[i] != this->types[j])
        {
            this->types[++i] = this->types[j];
        }
    }
    this->count = ++i;
    for (i; i < oldCount; i++)
    {
        this->types[i] = JITTypeHolder(nullptr);
    }

    this->sortedAndDuplicatesRemoved = true;
}